

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O1

void gguf_get_meta_data(gguf_context *ctx,void *data)

{
  pointer pcVar1;
  vector<signed_char,_std::allocator<signed_char>_> buf;
  vector<signed_char,_std::allocator<signed_char>_> local_28;
  
  local_28.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gguf_write_to_buf(ctx,&local_28,true);
  pcVar1 = local_28.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  memcpy(data,local_28.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start,
         (long)local_28.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_28.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1,(long)local_28.
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pcVar1);
  }
  return;
}

Assistant:

void gguf_get_meta_data(const struct gguf_context * ctx, void * data) {
    std::vector<int8_t> buf;
    gguf_write_to_buf(ctx, buf, /*only_meta =*/ true);
    memcpy(data, buf.data(), buf.size());
}